

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser * init_parse_class(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"name str name",parse_class_name);
  parser_reg(p_00,"stats int str int int int wis int dex int con",parse_class_stats);
  parser_reg(p_00,"skill-disarm-phys int base int incr",parse_class_skill_disarm_phys);
  parser_reg(p_00,"skill-disarm-magic int base int incr",parse_class_skill_disarm_magic);
  parser_reg(p_00,"skill-device int base int incr",parse_class_skill_device);
  parser_reg(p_00,"skill-save int base int incr",parse_class_skill_save);
  parser_reg(p_00,"skill-stealth int base int incr",parse_class_skill_stealth);
  parser_reg(p_00,"skill-search int base int incr",parse_class_skill_search);
  parser_reg(p_00,"skill-melee int base int incr",parse_class_skill_melee);
  parser_reg(p_00,"skill-shoot int base int incr",parse_class_skill_shoot);
  parser_reg(p_00,"skill-throw int base int incr",parse_class_skill_throw);
  parser_reg(p_00,"skill-dig int base int incr",parse_class_skill_dig);
  parser_reg(p_00,"hitdie int mhp",parse_class_hitdie);
  parser_reg(p_00,"exp int exp",parse_class_exp);
  parser_reg(p_00,"max-attacks int max-attacks",parse_class_max_attacks);
  parser_reg(p_00,"min-weight int min-weight",parse_class_min_weight);
  parser_reg(p_00,"strength-multiplier int att-multiply",parse_class_str_mult);
  parser_reg(p_00,"title str title",parse_class_title);
  parser_reg(p_00,"equip sym tval sym sval uint min uint max sym eopts",parse_class_equip);
  parser_reg(p_00,"obj-flags ?str flags",parse_class_obj_flags);
  parser_reg(p_00,"player-flags ?str flags",parse_class_play_flags);
  parser_reg(p_00,"magic uint first uint weight uint books",parse_class_magic);
  parser_reg(p_00,"book sym tval sym quality sym name uint spells str realm",parse_class_book);
  parser_reg(p_00,"book-graphics char glyph sym color",parse_class_book_graphics);
  parser_reg(p_00,"book-properties int cost int common str minmax",parse_class_book_properties);
  parser_reg(p_00,"spell sym name int level int mana int fail int exp",parse_class_spell);
  parser_reg(p_00,"effect sym eff ?sym type ?int radius ?int other",parse_class_effect);
  parser_reg(p_00,"effect-yx int y int x",parse_class_effect_yx);
  parser_reg(p_00,"dice str dice",parse_class_dice);
  parser_reg(p_00,"expr sym name sym base str expr",parse_class_expr);
  parser_reg(p_00,"effect-msg str text",parse_class_effect_msg);
  parser_reg(p_00,"desc str desc",parse_class_desc);
  return p_00;
}

Assistant:

static struct parser *init_parse_class(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_class_name);
	parser_reg(p, "stats int str int int int wis int dex int con",
			   parse_class_stats);
	parser_reg(p, "skill-disarm-phys int base int incr",
			   parse_class_skill_disarm_phys);
	parser_reg(p, "skill-disarm-magic int base int incr",
			   parse_class_skill_disarm_magic);
	parser_reg(p, "skill-device int base int incr", parse_class_skill_device);
	parser_reg(p, "skill-save int base int incr", parse_class_skill_save);
	parser_reg(p, "skill-stealth int base int incr", parse_class_skill_stealth);
	parser_reg(p, "skill-search int base int incr", parse_class_skill_search);
	parser_reg(p, "skill-melee int base int incr", parse_class_skill_melee);
	parser_reg(p, "skill-shoot int base int incr", parse_class_skill_shoot);
	parser_reg(p, "skill-throw int base int incr", parse_class_skill_throw);
	parser_reg(p, "skill-dig int base int incr", parse_class_skill_dig);
	parser_reg(p, "hitdie int mhp", parse_class_hitdie);
	parser_reg(p, "exp int exp", parse_class_exp);
	parser_reg(p, "max-attacks int max-attacks", parse_class_max_attacks);
	parser_reg(p, "min-weight int min-weight", parse_class_min_weight);
	parser_reg(p, "strength-multiplier int att-multiply", parse_class_str_mult);
	parser_reg(p, "title str title", parse_class_title);
	parser_reg(p, "equip sym tval sym sval uint min uint max sym eopts",
			   parse_class_equip);
	parser_reg(p, "obj-flags ?str flags", parse_class_obj_flags);
	parser_reg(p, "player-flags ?str flags", parse_class_play_flags);
	parser_reg(p, "magic uint first uint weight uint books", parse_class_magic);
	parser_reg(p, "book sym tval sym quality sym name uint spells str realm",
			   parse_class_book);
	parser_reg(p, "book-graphics char glyph sym color",
			   parse_class_book_graphics);
	parser_reg(p, "book-properties int cost int common str minmax",
			   parse_class_book_properties);
	parser_reg(p, "spell sym name int level int mana int fail int exp",
			   parse_class_spell);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_class_effect);
	parser_reg(p, "effect-yx int y int x", parse_class_effect_yx);
	parser_reg(p, "dice str dice", parse_class_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_class_expr);
	parser_reg(p, "effect-msg str text", parse_class_effect_msg);
	parser_reg(p, "desc str desc", parse_class_desc);
	return p;
}